

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

int Init12Video(void)

{
  ushort uVar1;
  SDL20_AllocFormat_t p_Var2;
  Uint16 maxh;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  VideoModeList *pVVar13;
  SDL12_Rect **ppSVar14;
  Uint16 maxw;
  SDL_bool SVar15;
  SDL_bool SVar16;
  Uint32 UVar17;
  uint uVar18;
  VideoModeList *pVVar19;
  bool bVar20;
  ushort uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  SDL_DisplayMode mode;
  uint h;
  SDL_DisplayMode local_80;
  ulong local_68;
  SDL12_Rect local_60;
  char *local_58;
  long local_50;
  ulong local_48;
  long local_40;
  uint local_34;
  
  pcVar7 = (*SDL20_GetCurrentVideoDriver)();
  pcVar8 = (*SDL20_getenv)("SDL12COMPAT_SCALE_METHOD");
  pcVar9 = (*SDL20_getenv)("SDL12COMPAT_MAX_BPP");
  if (pcVar9 == (char *)0x0) {
    lVar10 = 0x20;
  }
  else {
    lVar10 = (*SDL20_strtol)(pcVar9,(char **)0x0,10);
  }
  pcVar9 = (*SDL20_getenv)("SDL12COMPAT_ALLOW_THREADED_DRAWS");
  SVar15 = SDL_TRUE;
  SVar16 = SDL_TRUE;
  if (pcVar9 != (char *)0x0) {
    lVar11 = (*SDL20_strtol)(pcVar9,(char **)0x0,10);
    SVar16 = (SDL_bool)((int)lVar11 != 0);
  }
  AllowThreadedDraws = SVar16;
  pcVar9 = (*SDL20_getenv)("SDL12COMPAT_ALLOW_THREADED_PUMPS");
  if (pcVar9 != (char *)0x0) {
    lVar11 = (*SDL20_strtol)(pcVar9,(char **)0x0,10);
    SVar15 = (SDL_bool)((int)lVar11 != 0);
  }
  AllowThreadedPumps = SVar15;
  if (pcVar8 == (char *)0x0) {
    WantScaleMethodNearest = SDL_FALSE;
  }
  else {
    iVar3 = (*SDL20_strcmp)(pcVar8,"nearest");
    WantScaleMethodNearest = (SDL_bool)(iVar3 == 0);
  }
  SVar16 = TranslateKeyboardLayout;
  pcVar8 = (*SDL20_getenv)("SDL12COMPAT_USE_KEYBOARD_LAYOUT");
  if (pcVar8 != (char *)0x0) {
    lVar11 = (*SDL20_strtol)(pcVar8,(char **)0x0,10);
    SVar16 = (SDL_bool)((int)lVar11 != 0);
  }
  TranslateKeyboardLayout = SVar16;
  if (pcVar7 == (char *)0x0) {
    IsDummyVideo = SDL_FALSE;
  }
  else {
    iVar3 = (*SDL20_strcmp)(pcVar7,"dummy");
    IsDummyVideo = (SDL_bool)(iVar3 == 0);
  }
  EventQueueMutex = (*SDL20_CreateMutex)();
  auVar23 = _DAT_00118010;
  iVar3 = -1;
  if (EventQueueMutex != (SDL_mutex *)0x0) {
    lVar11 = 0x1c8;
    auVar22 = _DAT_00118000;
    do {
      lVar12 = auVar22._8_8_;
      if (SUB164(auVar22 ^ auVar23,4) == -0x80000000 && SUB164(auVar22 ^ auVar23,0) < -0x7fffff81) {
        *(EventQueueType **)(lVar11 + 0x129f88) = EventQueuePool + auVar22._0_8_ + 1;
        *(EventQueueType **)(&EventQueuePool[0].syswm_msg.version.major + lVar11) =
             EventQueuePool + lVar12 + 1;
      }
      auVar22._0_8_ = auVar22._0_8_ + 2;
      auVar22._8_8_ = lVar12 + 2;
      lVar11 = lVar11 + 0x1d0;
    } while (lVar11 != 0x75c8);
    EventQueuePool[0x7f].next = (EventQueueType *)0x0;
    EventQueueTail = (EventQueueType *)0x0;
    EventQueueHead = (EventQueueType *)0x0;
    EventQueueAvailable = EventQueuePool;
    (*SDL20_memset)(&PendingKeydownEvent,0,0x18);
    (*SDL20_memset)(EventStates,1,0x20);
    EventStates[0xd] = '\0';
    (*SDL20_EventState)(0x201,0);
    iVar3 = (*SDL20_strcmp)(pcVar7,"x11");
    SupportSysWM = (SDL_bool)(iVar3 == 0);
    pcVar8 = (*SDL20_getenv)("SDL12COMPAT_ALLOW_SYSWM");
    if ((pcVar8 != (char *)0x0) &&
       (lVar11 = (*SDL20_strtol)(pcVar8,(char **)0x0,10), (int)lVar11 == 0)) {
      SupportSysWM = SDL_FALSE;
    }
    KeyRepeatEvent.type = '\0';
    KeyRepeatNextTicks = 0;
    KeyRepeatDelay = 0;
    KeyRepeatInterval = 0;
    (*SDL20_DelEventWatch)(EventFilter20to12,(void *)0x0);
    (*SDL20_AddEventWatch)(EventFilter20to12,(void *)0x0);
    pcVar8 = (*SDL20_getenv)("SDL_VIDEO_FULLSCREEN_DISPLAY");
    if ((pcVar8 == (char *)0x0) &&
       (pcVar8 = (*SDL20_getenv)("SDL_VIDEO_FULLSCREEN_HEAD"), pcVar8 == (char *)0x0)) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      lVar11 = (*SDL20_strtol)(pcVar8,(char **)0x0,10);
      if ((-1 < (int)lVar11) && (iVar4 = (*SDL20_GetNumVideoDisplays)(), (int)lVar11 < iVar4)) {
        lVar11 = (*SDL20_strtol)(pcVar8,(char **)0x0,10);
        iVar3 = (int)lVar11;
      }
    }
    SwapInterval = 0;
    VideoWindowGrabbed = SDL_FALSE;
    VideoCursorHidden = SDL_FALSE;
    SVar16 = SDL_TRUE;
    VideoDisplayIndex = iVar3;
    (*SDL20_ShowCursor)(1);
    iVar3 = (*SDL20_GetNumDisplayModes)(VideoDisplayIndex);
    pcVar8 = (*SDL20_getenv)("SDL12COMPAT_MAX_BPP");
    if (pcVar8 == (char *)0x0) {
      lVar11 = 0x20;
    }
    else {
      lVar11 = (*SDL20_strtol)(pcVar8,(char **)0x0,10);
    }
    local_60.x = 0;
    local_60.y = 0;
    local_60.w = 0;
    local_60.h = 0;
    pcVar8 = (*SDL20_getenv)("SDL12COMPAT_OPENGL_SCALING");
    if (pcVar8 != (char *)0x0) {
      lVar12 = (*SDL20_strtol)(pcVar8,(char **)0x0,10);
      SVar16 = (SDL_bool)((int)lVar12 != 0);
    }
    if (VideoModesCount < 1) {
      pcVar8 = (*SDL20_getenv)("SDL12COMPAT_PRESERVE_DEST_ALPHA");
      if (pcVar8 == (char *)0x0) {
        PreserveDestinationAlpha = SDL_TRUE;
      }
      else {
        lVar12 = (*SDL20_strtol)(pcVar8,(char **)0x0,10);
        PreserveDestinationAlpha = (SDL_bool)((int)lVar12 != 0);
      }
      WantOpenGLScaling = SVar16;
      pcVar8 = (*SDL20_getenv)("SDL12COMPAT_MAX_VIDMODE");
      maxw = 0;
      local_50 = lVar10;
      if (pcVar8 == (char *)0x0) {
        maxh = 0;
      }
      else {
        local_80.format = 0;
        local_34 = 0;
        SDL_sscanf(pcVar8,"%ux%u",&local_80,&local_34);
        UVar17 = local_80.format;
        if (0xfffe < local_80.format) {
          UVar17 = 0xffff;
        }
        maxw = (Uint16)UVar17;
        uVar18 = 0xffff;
        if (local_34 < 0xffff) {
          uVar18 = local_34;
        }
        maxh = (Uint16)uVar18;
      }
      iVar4 = 0;
      local_58 = pcVar7;
      if (iVar3 < 1) {
        local_68 = 0;
        uVar21 = 0;
        pVVar19 = (VideoModeList *)0x0;
      }
      else {
        local_48 = (ulong)((int)lVar11 << 0x1d | (int)lVar11 - 8U >> 3);
        pVVar19 = (VideoModeList *)0x0;
        uVar21 = 0;
        local_68 = 0;
        local_40 = lVar11;
        do {
          iVar5 = (*SDL20_GetDisplayMode)(VideoDisplayIndex,iVar4,&local_80);
          if (-1 < iVar5) {
            uVar18 = CONCAT22(local_80.w._2_2_,(ushort)local_80.w);
            uVar6 = CONCAT22(local_80.h._2_2_,(ushort)local_80.h);
            if (uVar6 == 0 && uVar18 == 0) {
              if ((IsDummyVideo == SDL_FALSE) || (0x7df < LinkedSDL2VersionInt)) goto LAB_00107b81;
              local_80.h._0_2_ = 0x300;
              local_80.h._2_2_ = 0;
              local_80.format = 0x16161804;
              local_80.w._0_2_ = 0x400;
              local_80.w._2_2_ = 0;
              uVar18 = 0x400;
              uVar6 = 0x300;
            }
            if ((0 < (int)uVar6 && 0 < (int)uVar18) && (uVar6 < 0x10000 && uVar18 < 0x10000)) {
              if ((uint)local_40 < (local_80.format >> 8 & 0xff)) {
                if ((uint)local_48 < 4) {
                  local_80.format = *(Uint32 *)(&DAT_001182a0 + local_48 * 4);
                }
                else {
                  (*SDL20_SetError)("Unsupported bits-per-pixel");
                  local_80.format = 0;
                }
              }
              if ((pVVar19 == (VideoModeList *)0x0) || (local_80.format != pVVar19->format)) {
                pVVar13 = (VideoModeList *)
                          (*SDL20_realloc)(VideoModes,(long)VideoModesCount * 0x18 + 0x18);
                if (pVVar13 != (VideoModeList *)0x0) {
                  lVar10 = (long)VideoModesCount;
                  pVVar19 = pVVar13 + lVar10;
                  VideoModes = pVVar13;
                  pVVar13[lVar10].format = local_80.format;
                  VideoModesCount = VideoModesCount + 1;
                  *(undefined1 (*) [16])&pVVar13[lVar10].nummodes = (undefined1  [16])0x0;
                  *(undefined4 *)((long)&pVVar13[lVar10].modes12 + 4) = 0;
                  goto LAB_00107ad0;
                }
              }
              else {
LAB_00107ad0:
                auVar23._2_2_ = local_80.w._2_2_;
                auVar23._0_2_ = (ushort)local_80.w;
                auVar23._4_2_ = (ushort)local_80.h;
                auVar23._6_2_ = local_80.h._2_2_;
                auVar23._8_8_ = 0;
                auVar23 = pshuflw(auVar23,auVar23,0xe8);
                local_60.w = (short)auVar23._0_4_;
                local_60.h = (short)((uint)auVar23._0_4_ >> 0x10);
                if (SVar16 != SDL_FALSE) {
                  lVar10 = 0;
                  do {
                    uVar1 = *(ushort *)((long)&fake_modes[0].w + lVar10);
                    if ((uVar1 < uVar21) ||
                       ((uVar1 <= uVar21 &&
                        (*(ushort *)((long)&fake_modes[0].h + lVar10) < (ushort)local_68)))) {
                      if (((local_60.w < uVar1) ||
                          ((local_60.w <= uVar1 &&
                           (local_60.h < *(ushort *)((long)&fake_modes[0].h + lVar10))))) &&
                         (iVar5 = AddVidModeToList(pVVar19,(SDL12_Rect *)
                                                           ((long)&fake_modes[0].x + lVar10),maxw,
                                                   maxh), iVar5 != 0)) goto LAB_00107c7c;
                    }
                    lVar10 = lVar10 + 8;
                  } while (lVar10 != 0xe8);
                }
                iVar5 = AddVidModeToList(pVVar19,&local_60,maxw,maxh);
                if (iVar5 == 0) {
                  local_68 = (ulong)(ushort)local_80.h;
                  uVar21 = (ushort)local_80.w;
                  goto LAB_00107b81;
                }
              }
LAB_00107c7c:
              iVar3 = (*SDL20_Error)(SDL_ENOMEM);
              lVar10 = local_50;
              pcVar7 = local_58;
              goto LAB_00107d48;
            }
          }
LAB_00107b81:
          iVar4 = iVar4 + 1;
        } while (iVar4 != iVar3);
      }
      lVar10 = local_50;
      if (SVar16 != SDL_FALSE) {
        lVar11 = 0;
        do {
          uVar1 = *(ushort *)((long)&fake_modes[0].w + lVar11);
          if (((uVar1 < uVar21) ||
              ((uVar1 <= uVar21 && (*(ushort *)((long)&fake_modes[0].h + lVar11) < (ushort)local_68)
               ))) && (iVar3 = AddVidModeToList(pVVar19,(SDL12_Rect *)
                                                        ((long)&fake_modes[0].x + lVar11),maxw,maxh)
                      , iVar3 != 0)) {
            iVar3 = (*SDL20_Error)(SDL_ENOMEM);
            pcVar7 = local_58;
            goto LAB_00107d48;
          }
          lVar11 = lVar11 + 8;
        } while (lVar11 != 0xe8);
      }
      pcVar7 = local_58;
      if (0 < VideoModesCount) {
        iVar3 = 0;
        pVVar19 = VideoModes;
LAB_00107c0d:
        iVar4 = pVVar19->nummodes;
        ppSVar14 = (SDL12_Rect **)(*SDL20_calloc)(8,(long)iVar4 + 1);
        pVVar19->modes12 = ppSVar14;
        if (ppSVar14 != (SDL12_Rect **)0x0) goto code_r0x00107c2d;
        iVar3 = (*SDL20_Error)(SDL_ENOMEM);
LAB_00107d48:
        if (iVar3 < 0) {
          return -1;
        }
        goto LAB_0010785e;
      }
LAB_00107c5e:
      QueuedDisplayOverlays.next = (QueuedOverlayItem *)0x0;
      QueuedDisplayOverlaysTail = &QueuedDisplayOverlays;
    }
LAB_0010785e:
    (*SDL20_StopTextInput)();
    iVar4 = (*SDL20_GetDesktopDisplayMode)(VideoDisplayIndex,&local_80);
    p_Var2 = SDL20_AllocFormat;
    iVar3 = 0;
    if (iVar4 == 0) {
      uVar18 = (uint)lVar10;
      UVar17 = local_80.format;
      if (uVar18 < (local_80.format >> 8 & 0xff)) {
        uVar18 = uVar18 << 0x1d | uVar18 - 8 >> 3;
        if (uVar18 < 4) {
          UVar17 = *(Uint32 *)(&DAT_001182a0 + (ulong)uVar18 * 4);
        }
        else {
          UVar17 = 0;
          (*SDL20_SetError)("Unsupported bits-per-pixel");
        }
      }
      VideoInfoVfmt20 = (*p_Var2)(UVar17);
      PixelFormat20to12(&VideoInfoVfmt12,&VideoInfoPalette12,VideoInfoVfmt20);
      VideoInfo12.vfmt = &VideoInfoVfmt12;
      VideoInfo12.current_w._2_2_ = local_80.w._2_2_;
      VideoInfo12.current_w._0_2_ = (ushort)local_80.w;
      VideoInfo12.current_h._0_2_ = (ushort)local_80.h;
      VideoInfo12.current_h._2_2_ = local_80.h._2_2_;
      bVar20 = false;
      lVar10 = 0;
      do {
        iVar3 = (*SDL20_strcasecmp)(pcVar7,(char *)((long)&HasWmAvailable_gui_targets_rel +
                                                   (long)(int)(&HasWmAvailable_gui_targets_rel)
                                                              [lVar10]));
        if (bVar20) break;
        lVar10 = 1;
        bVar20 = true;
      } while (iVar3 != 0);
      VideoInfo12._0_4_ = (VideoInfo12._0_4_ & 0xfffffffd) + (uint)(iVar3 == 0) * 2;
      VideoInfo12.video_mem = 0x40000;
      iVar3 = 0;
    }
  }
  return iVar3;
code_r0x00107c2d:
  if (0 < iVar4) {
    lVar11 = 0;
    do {
      *(long *)((long)pVVar19->modes12 + lVar11) = (long)&pVVar19->modeslist12->x + lVar11;
      lVar11 = lVar11 + 8;
    } while ((long)iVar4 * 8 != lVar11);
  }
  iVar3 = iVar3 + 1;
  pVVar19 = pVVar19 + 1;
  if (VideoModesCount <= iVar3) goto LAB_00107c5e;
  goto LAB_00107c0d;
}

Assistant:

static int
Init12Video(void)
{
    const char *driver = SDL20_GetCurrentVideoDriver();
    const char *scale_method_env = SDL12Compat_GetHint("SDL12COMPAT_SCALE_METHOD");
    const unsigned max_bpp = SDL12Compat_GetHintInt("SDL12COMPAT_MAX_BPP", 32);
    SDL_DisplayMode mode;
    int i;

    AllowThreadedDraws = SDL12Compat_GetHintBoolean("SDL12COMPAT_ALLOW_THREADED_DRAWS", SDL_TRUE);
    AllowThreadedPumps = SDL12Compat_GetHintBoolean("SDL12COMPAT_ALLOW_THREADED_PUMPS", SDL_TRUE);

    WantScaleMethodNearest = (scale_method_env && !SDL20_strcmp(scale_method_env, "nearest")) ? SDL_TRUE : SDL_FALSE;

    /* Only override this if the env var is set, as the default is platform-specific. */
    TranslateKeyboardLayout = SDL12Compat_GetHintBoolean("SDL12COMPAT_USE_KEYBOARD_LAYOUT", TranslateKeyboardLayout);

    IsDummyVideo = ((driver != NULL) && (SDL20_strcmp(driver, "dummy") == 0)) ? SDL_TRUE : SDL_FALSE;

    EventQueueMutex = SDL20_CreateMutex();
    if (EventQueueMutex == NULL) {
        return -1;
    }

    for (i = 0; i < SDL12_MAXEVENTS-1; i++) {
        EventQueuePool[i].next = &EventQueuePool[i+1];
    }
    EventQueuePool[SDL12_MAXEVENTS-1].next = NULL;

    EventQueueHead = EventQueueTail = NULL;
    EventQueueAvailable = EventQueuePool;

    SDL20_memset(&PendingKeydownEvent, 0, sizeof(SDL12_Event));

    SDL20_memset(EventStates, SDL_ENABLE, sizeof (EventStates)); /* on by default */

    EventStates[SDL12_SYSWMEVENT] = SDL_IGNORE;  /* off by default. */
    SDL20_EventState(SDL_SYSWMEVENT, SDL_IGNORE);

#if defined(SDL_VIDEO_DRIVER_WINDOWS)
    SupportSysWM = (SDL20_strcmp(driver, "windows") == 0) ? SDL_TRUE : SDL_FALSE;
#elif defined(SDL_VIDEO_DRIVER_X11)
    SupportSysWM = (SDL20_strcmp(driver, "x11") == 0) ? SDL_TRUE : SDL_FALSE;
#else
    SupportSysWM = SDL_FALSE;
#endif

    if (!SDL12Compat_GetHintBoolean("SDL12COMPAT_ALLOW_SYSWM", SDL_TRUE)) {
        SupportSysWM = SDL_FALSE;
    }

    SDL_EnableKeyRepeat(0, 0);

    SDL20_DelEventWatch(EventFilter20to12, NULL);
    SDL20_AddEventWatch(EventFilter20to12, NULL);

    VideoDisplayIndex = GetVideoDisplay();
    SwapInterval = 0;

    VideoWindowGrabbed = SDL_FALSE;
    VideoCursorHidden = SDL_FALSE;
    SDL20_ShowCursor(1);

    if (Init12VidModes() < 0) {
        return -1;
    }

    SDL20_StopTextInput();

    if (SDL20_GetDesktopDisplayMode(VideoDisplayIndex, &mode) == 0) {
        if (SDL_BITSPERPIXEL(mode.format) > max_bpp) {
            VideoInfoVfmt20 = SDL20_AllocFormat(BPPToPixelFormat(max_bpp));
        } else {
            VideoInfoVfmt20 = SDL20_AllocFormat(mode.format);
        }
        VideoInfo12.vfmt = PixelFormat20to12(&VideoInfoVfmt12, &VideoInfoPalette12, VideoInfoVfmt20);
        VideoInfo12.current_w = mode.w;
        VideoInfo12.current_h = mode.h;
        VideoInfo12.wm_available = HasWmAvailable(driver);
        VideoInfo12.video_mem = 1024 * 256;  /* good enough. */
    }

    return 0;
}